

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_bool(yajl_gen g,int boolean)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  
  pcVar6 = "true";
  if (boolean == 0) {
    pcVar6 = "false";
  }
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00105bf4_caseD_4;
    pcVar4 = " ";
    break;
  default:
    goto switchD_00105bf4_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00105bf4_caseD_4;
    pcVar4 = "\n";
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar4,1);
switchD_00105bf4_caseD_4:
  if ((((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val)) && (g->depth != 0)) {
    uVar5 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar4 = g->indentString;
      sVar3 = strlen(pcVar4);
      (*p_Var1)(pvVar2,pcVar4,sVar3 & 0xffffffff);
      uVar5 = uVar5 + 1;
    } while (uVar5 < g->depth);
  }
  (*g->print)(g->ctx,pcVar6,SUB18(boolean == 0,0) + 4);
  uVar5 = g->depth;
  if ((ulong)g->state[uVar5] < 5) {
    g->state[uVar5] = *(yajl_gen_state *)(&DAT_001079b8 + (ulong)g->state[uVar5] * 4);
  }
  if (((g->flags & 1) != 0) && (g->state[uVar5] == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_bool(yajl_gen g, int boolean)
{
    const char * val = boolean ? "true" : "false";

	ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, val, (unsigned int)strlen(val));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}